

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Label::Label(Label *this,string *text,bool centred)

{
  byte in_DL;
  string *in_RSI;
  Widget *in_RDI;
  
  Widget::Widget(in_RDI);
  in_RDI->_vptr_Widget = (_func_int **)&PTR__Label_00112760;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  *(byte *)&in_RDI[1].x1 = in_DL & 1;
  return;
}

Assistant:

Label::Label(std::string text, bool centred) :
   text(text),
   centred(centred)
{
}